

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain_struct
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  size_t sVar1;
  uint32_t uVar2;
  SPIRType *type;
  SPIRType *pSVar3;
  uint32_t i;
  uint32_t index;
  ulong uVar4;
  uint local_114;
  SmallVector<unsigned_int,_8UL> subcomposite_chain;
  SPIRAccessChain local_d8;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(chain->super_IVariant).field_0xc);
  sVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  SPIRAccessChain::SPIRAccessChain(&local_d8,chain);
  SmallVector<unsigned_int,_8UL>::SmallVector(&subcomposite_chain,composite_chain);
  local_114 = 0;
  SmallVector<unsigned_int,_8UL>::push_back(&subcomposite_chain,&local_114);
  for (uVar4 = 0; (uint)sVar1 != uVar4; uVar4 = uVar4 + 1) {
    index = (uint32_t)uVar4;
    uVar2 = Compiler::type_struct_member_offset((Compiler *)this,type,index);
    local_d8.static_index = uVar2 + chain->static_index;
    local_d8.super_IVariant._12_4_ =
         (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
         [uVar4].id;
    local_d8.row_major_matrix = false;
    local_d8.matrix_stride = 0;
    local_d8.array_stride = 0;
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_d8.super_IVariant._12_4_);
    if (1 < pSVar3->columns) {
      uVar2 = Compiler::type_struct_member_matrix_stride((Compiler *)this,type,index);
      local_d8.matrix_stride = uVar2;
      local_d8.row_major_matrix =
           Compiler::has_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                      DecorationRowMajor);
    }
    if ((pSVar3->array).super_VectorView<unsigned_int>.buffer_size != 0) {
      uVar2 = Compiler::type_struct_member_array_stride((Compiler *)this,type,index);
      local_d8.array_stride = uVar2;
    }
    subcomposite_chain.super_VectorView<unsigned_int>.ptr
    [subcomposite_chain.super_VectorView<unsigned_int>.buffer_size - 1] = index;
    write_access_chain(this,&local_d8,value,&subcomposite_chain);
  }
  SmallVector<unsigned_int,_8UL>::~SmallVector(&subcomposite_chain);
  SPIRAccessChain::~SPIRAccessChain(&local_d8);
  return;
}

Assistant:

void CompilerHLSL::write_access_chain_struct(const SPIRAccessChain &chain, uint32_t value,
                                             const SmallVector<uint32_t> &composite_chain)
{
	auto &type = get<SPIRType>(chain.basetype);
	uint32_t member_count = uint32_t(type.member_types.size());
	auto subchain = chain;

	auto subcomposite_chain = composite_chain;
	subcomposite_chain.push_back(0);

	for (uint32_t i = 0; i < member_count; i++)
	{
		uint32_t offset = type_struct_member_offset(type, i);
		subchain.static_index = chain.static_index + offset;
		subchain.basetype = type.member_types[i];

		subchain.matrix_stride = 0;
		subchain.array_stride = 0;
		subchain.row_major_matrix = false;

		auto &member_type = get<SPIRType>(subchain.basetype);
		if (member_type.columns > 1)
		{
			subchain.matrix_stride = type_struct_member_matrix_stride(type, i);
			subchain.row_major_matrix = has_member_decoration(type.self, i, DecorationRowMajor);
		}

		if (!member_type.array.empty())
			subchain.array_stride = type_struct_member_array_stride(type, i);

		subcomposite_chain.back() = i;
		write_access_chain(subchain, value, subcomposite_chain);
	}
}